

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O1

void __thiscall Creature::make_sweet_sweet_love(Creature *this,Creature *mate,size_t xpnt)

{
  runtime_error *this_00;
  pointer psVar1;
  pointer psVar2;
  double dVar3;
  
  psVar1 = (this->chroms).
           super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 !=
      (long)(mate->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mate->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Mate has wrong number of chromosomes! Sick!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar2 = psVar1;
  if (psVar1 != (this->chroms).
                super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (psVar1->px == (Chromosome *)0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Chromosome>::operator->() const [T = Chromosome]"
                     );
      }
      Chromosome::crossover
                (psVar1->px,
                 (shared_ptr<Chromosome> *)
                 (((long)(mate->chroms).
                         super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                  (long)(this->chroms).
                        super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) + (long)psVar2),xpnt);
      psVar1 = psVar1 + 1;
      psVar2 = psVar2 + 1;
    } while (psVar1 != (this->chroms).
                       super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  dVar3 = make_fitness(this);
  this->fitness = dVar3;
  dVar3 = make_fitness(this);
  mate->fitness = dVar3;
  return;
}

Assistant:

void Creature::make_sweet_sweet_love( Creature & mate, size_t xpnt )
{
	if(chroms.size() != mate.chroms.size())
	{
		throw std::runtime_error("Mate has wrong number of chromosomes! Sick!");
	}

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		(*it)->crossover(mate.chroms[std::distance(chroms.begin(), it)], xpnt);
	}

	fitness = make_fitness();
	mate.fitness = make_fitness();
}